

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
FindInPackageParents
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Package *package,CTransactionRef *ptx)

{
  element_type *peVar1;
  pointer pCVar2;
  const_reference pvVar3;
  size_type sVar4;
  CTxIn *input;
  pointer __v;
  long in_FS_OFFSET;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  possible_parents;
  size_type local_70;
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar1 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__v = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start; __v != pCVar2; __v = __v + 1) {
    std::
    _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
    ::_M_insert_unique<transaction_identifier<false>const&>
              ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                *)&local_68,(transaction_identifier<false> *)__v);
  }
  for (local_70 = 0;
      local_70 <
      (ulong)((long)(package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(package->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4); local_70 = local_70 + 1) {
    pvVar3 = std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::at(package,local_70);
    peVar1 = (pvVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    break;
    sVar4 = std::
            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
            ::count((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&local_68,&peVar1->hash);
    if (sVar4 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&local_70);
    }
  }
  std::
  _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<size_t> FindInPackageParents(const Package& package, const CTransactionRef& ptx)
{
    std::vector<size_t> in_package_parents;

    std::set<Txid> possible_parents;
    for (auto &input : ptx->vin) {
        possible_parents.insert(input.prevout.hash);
    }

    for (size_t i{0}; i < package.size(); ++i) {
        const auto& tx = package.at(i);
        // We assume the package is sorted, so that we don't need to continue
        // looking past the transaction itself.
        if (&(*tx) == &(*ptx)) break;
        if (possible_parents.count(tx->GetHash())) {
            in_package_parents.push_back(i);
        }
    }
    return in_package_parents;
}